

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_ClearOverlays(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  bool bVar4;
  DPSprite *this_00;
  int iVar5;
  int iVar6;
  int iVar7;
  char *__assertion;
  int u;
  int val;
  DObject *this_01;
  TObjPtr<DPSprite> *obj;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c81a5;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_004c8195;
  this_01 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (DObject *)0x0) goto LAB_004c7f3f;
    bVar3 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004c81a5;
    }
  }
  else {
    if (this_01 != (DObject *)0x0) goto LAB_004c8195;
LAB_004c7f3f:
    this_01 = (DObject *)0x0;
  }
  bVar3 = true;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_004c8195:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_004c81a5;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar4)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c81a5;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_004c8195;
    }
    if (2 < (uint)numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_004c81a5:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x48f,
                      "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar7 = param[3].field_0.i;
        }
        else {
          iVar7 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x490,
                          "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)")
            ;
          }
        }
        iVar5 = 0;
        if (4 < (uint)numparam) {
          VVar1 = param[4].field_0.field_3.Type;
          if (VVar1 == '\0') {
            iVar5 = param[4].field_0.i;
          }
          else {
            iVar5 = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x491,
                            "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam != 5) {
            VVar1 = param[5].field_0.field_3.Type;
            if (VVar1 == '\0') {
              bVar3 = param[5].field_0.i != 0;
            }
            else if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x492,
                            "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
          }
        }
        goto LAB_004c7fdd;
      }
    }
  }
  iVar5 = 0;
  iVar7 = 0;
LAB_004c7fdd:
  if (*(long *)&this_01[0xc].ObjectFlags == 0) {
    if (numret < 1) {
      return 0;
    }
    val = 0;
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x495,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  else {
    iVar6 = (uint)(bVar3 ^ 1) * 3 + 0x7ffffffc;
    if (iVar7 != 0 || iVar5 != 0) {
      iVar6 = iVar5;
    }
    obj = (TObjPtr<DPSprite> *)(*(long *)&this_01[0xc].ObjectFlags + 0xe0);
    val = 0;
    while (this_00 = GC::ReadBarrier<DPSprite>((DPSprite **)obj), this_00 != (DPSprite *)0x0) {
      iVar2 = this_00->ID;
      if ((iVar2 != 0) && (iVar7 <= iVar2 || iVar7 == 0 && iVar5 == 0)) {
        if (iVar6 < iVar2) break;
        if (bVar3 != false) {
          if (0x7ffffffc < iVar2) break;
          if (((iVar2 == -1) || (iVar2 == 1)) || (iVar2 == 1000)) goto LAB_004c806a;
        }
        DPSprite::SetState(this_00,(FState *)0x0,false);
        val = val + 1;
      }
LAB_004c806a:
      obj = &this_00->Next;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4b5,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ClearOverlays)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(start) { start = 0; }
	PARAM_INT_OPT(stop) { stop = 0; }
	PARAM_BOOL_OPT(safety) { safety = true; }

	if (self->player == nullptr)
		ACTION_RETURN_INT(0);

	if (!start && !stop)
	{
		start = INT_MIN;
		stop = safety ? PSP_TARGETCENTER - 1 : INT_MAX;
	}

	unsigned int count = 0;
	int id;

	for (DPSprite *pspr = self->player->psprites; pspr != nullptr; pspr = pspr->GetNext())
	{
		id = pspr->GetID();

		if (id < start || id == 0)
			continue;
		else if (id > stop)
			break;

		if (safety)
		{
			if (id >= PSP_TARGETCENTER)
				break;
			else if (id == PSP_STRIFEHANDS || id == PSP_WEAPON || id == PSP_FLASH)
				continue;
		}

		pspr->SetState(nullptr);
		count++;
	}

	ACTION_RETURN_INT(count);
}